

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to16.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack4to16_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  int _c;
  undefined8 in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2c0;
  undefined4 local_2b4;
  undefined8 local_2a8;
  void *local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined4 local_270;
  long local_268;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  Mat *in_stack_fffffffffffffdb8;
  undefined4 *local_240;
  int local_238;
  void *local_228;
  int *local_220;
  long local_218;
  long *local_208;
  int local_1fc;
  int local_1f8;
  long local_1e8;
  int local_1dc;
  int local_1d0;
  int local_1cc;
  long *local_1c8;
  undefined8 *local_1b8;
  undefined8 *local_1a8;
  void **local_1a0;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  undefined8 *local_168;
  undefined8 *local_148;
  undefined1 local_13d;
  int local_13c;
  void **local_138;
  undefined8 *local_130;
  undefined1 local_10d;
  int local_10c;
  undefined8 *local_100;
  undefined8 *local_e0;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined4 *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  void *local_40;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  local_1dc = in_R8D * in_R9D;
  local_1d0 = in_ECX;
  local_1cc = in_EDX;
  local_1c8 = in_RSI;
  Mat::reshape(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdac,
               (Allocator *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  Mat::create(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
              (int)in_stack_fffffffffffffcd8,_c,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0)
  ;
  for (local_238 = 0; local_238 + 0xf < local_1d0; local_238 = local_238 + 0x10) {
    local_10c = local_238 / 0x10;
    local_100 = &local_288;
    local_64 = *(int *)((long)local_1c8 + 0x2c);
    local_68 = (int)local_1c8[6];
    local_6c = *(undefined4 *)((long)local_1c8 + 0x34);
    local_78 = (undefined4 *)(*local_1c8 + local_1c8[8] * (long)local_10c * local_1c8[2]);
    local_80 = local_1c8[2];
    local_84 = (undefined4)local_1c8[3];
    local_90 = local_1c8[4];
    local_60 = &local_288;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_e0 = &local_288;
    local_1b8 = &local_288;
    local_c = 0x10;
    local_10d = 1;
    local_288 = 0;
    local_278 = 0;
    local_270 = 0;
    local_280 = 0;
    local_240 = local_78;
    for (local_28c = 0; local_28c + 3 < local_1cc; local_28c = local_28c + 4) {
      for (local_290 = 0; local_290 < local_1dc; local_290 = local_290 + 1) {
        for (local_294 = 0; local_294 < 4; local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < 0x10; local_298 = local_298 + 1) {
            local_13c = local_238 + local_298;
            local_130 = &local_2e8;
            local_138 = &local_228;
            local_40 = (void *)((long)local_228 + local_1e8 * local_13c * local_218);
            local_28 = &local_2e8;
            local_18 = (long)local_1fc * (long)local_1f8 * local_218;
            local_9c = local_28c + local_294;
            local_98 = &local_2e8;
            local_2a0 = (void *)((long)local_40 + (long)local_1fc * (long)local_9c * local_218);
            local_1a8 = &local_2e8;
            local_1c = 0x10;
            local_13d = 1;
            local_2e8 = 0;
            local_2c0 = 0;
            local_2b4 = 0;
            local_2a8 = 0;
            local_2e0 = 0;
            *local_240 = *(undefined4 *)((long)local_2a0 + (long)local_290 * 4);
            local_240 = local_240 + 1;
            local_168 = local_1a8;
          }
        }
      }
    }
    local_148 = local_1b8;
    local_268 = local_90;
  }
  local_1a0 = &local_228;
  if (local_220 != (int *)0x0) {
    local_17c = 0xffffffff;
    LOCK();
    local_180 = *local_220;
    *local_220 = *local_220 + -1;
    UNLOCK();
    if (local_180 == 1) {
      local_178 = local_1a0;
      if (local_208 == (long *)0x0) {
        if (local_228 != (void *)0x0) {
          free(local_228);
        }
      }
      else {
        (**(code **)(*local_208 + 0x18))(local_208,local_228);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-4a-maxk-inch/4a-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 4 * maxk, inch / 4, outch / 16, (size_t)4u);

    for (int q = 0; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}